

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

double * __thiscall Graph::getLossesReseting(Graph *this)

{
  bool bVar1;
  int idTree;
  double *pdVar2;
  double dVar3;
  Edge *local_28;
  Edge *a;
  Vertex *no;
  double *perda;
  Graph *this_local;
  
  pdVar2 = (double *)operator_new__(0x10);
  pdVar2[1] = 0.0;
  *pdVar2 = 0.0;
  for (a = (Edge *)this->verticesList; a != (Edge *)0x0; a = (Edge *)Vertex::getNext((Vertex *)a)) {
    idTree = Vertex::getID((Vertex *)a);
    Vertex::setIdTree((Vertex *)a,idTree);
    for (local_28 = Vertex::getEdgesList((Vertex *)a); local_28 != (Edge *)0x0;
        local_28 = Edge::getNext(local_28)) {
      dVar3 = Edge::getActiveLoss(local_28);
      *pdVar2 = dVar3 + *pdVar2;
      dVar3 = Edge::getReactiveLoss(local_28);
      pdVar2[1] = dVar3 + pdVar2[1];
      bVar1 = Edge::getModifiable(local_28);
      if (bVar1) {
        Edge::setSwitch(local_28,false);
      }
      else {
        Edge::setSwitch(local_28,true);
      }
      Edge::setActiveFlow(local_28,0.0);
      Edge::setReactiveFlow(local_28,0.0);
      Edge::setActiveLoss(local_28,0.0);
      Edge::setReactiveLoss(local_28,0.0);
    }
  }
  return pdVar2;
}

Assistant:

double *Graph::getLossesReseting(){
    double *perda = new double[2]; perda[0] = perda[1] = 0.0;
    for(Vertex *no=verticesList; no != NULL; no = no->getNext()){
        no->setIdTree(no->getID());
        for(Edge *a = no->getEdgesList(); a != NULL; a = a->getNext()){
            perda[0] += a->getActiveLoss();
            perda[1] += a->getReactiveLoss();

            //arcos nao modificaveis ficam sempre fechados
            if(a->getModifiable() == false)
                a->setSwitch(true);
            else
                a->setSwitch(false);

            a->setActiveFlow(0.0);
            a->setReactiveFlow(0.0);
            a->setActiveLoss(0.0);
            a->setReactiveLoss(0.0);
        }
    }
    return perda;
}